

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O1

string_t * __thiscall
cfgfile::tag_scalar_vector_t<int,cfgfile::string_trait_t>::print_abi_cxx11_
          (string_t *__return_storage_ptr__,void *this,int indent)

{
  format_t<int,cfgfile::string_trait_t> *pfVar1;
  undefined8 *puVar2;
  int iVar3;
  bool bVar4;
  long *plVar5;
  long *plVar6;
  int *value_00;
  char cVar7;
  int *v;
  format_t<int,cfgfile::string_trait_t> *this_00;
  undefined8 *puVar8;
  string_t value;
  string_t local_90;
  int local_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  long *local_58;
  string_t local_50;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this);
  if (bVar4) {
    local_60 = (long)indent;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)indent);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    cVar7 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)((long)this + 8));
    this_00 = *(format_t<int,cfgfile::string_trait_t> **)((long)this + 0x60);
    pfVar1 = *(format_t<int,cfgfile::string_trait_t> **)((long)this + 0x68);
    local_6c = indent;
    local_58 = (long *)this;
    if (this_00 != pfVar1) {
      do {
        std::__cxx11::string::push_back(cVar7);
        format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_(&local_90,this_00,value_00);
        to_cfgfile_format<cfgfile::string_trait_t>(&local_50,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        this_00 = this_00 + 4;
      } while (this_00 != pfVar1);
    }
    plVar6 = local_58;
    plVar5 = (long *)(**(code **)(*local_58 + 0x10))(local_58);
    iVar3 = local_6c;
    if (*plVar5 != plVar5[1]) {
      std::__cxx11::string::push_back(cVar7);
      plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6);
      puVar8 = (undefined8 *)*plVar6;
      puVar2 = (undefined8 *)plVar6[1];
      if (puVar8 != puVar2) {
        do {
          (**(code **)(*(long *)*puVar8 + 0x18))(&local_90,(long *)*puVar8,iVar3 + 1);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar2);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_90,(char)local_60);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::push_back(cVar7);
    std::__cxx11::string::push_back(cVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}